

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

double __thiscall icu_63::Formattable::getDouble(Formattable *this,UErrorCode *status)

{
  UBool UVar1;
  Formattable *this_00;
  double dVar2;
  UErrorCode *status_local;
  Formattable *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    switch(this->fType) {
    case kDouble:
      this_local = (this->fValue).fArrayAndCount.fArray;
      break;
    case kLong:
    case kInt64:
      this_local = (Formattable *)(double)(this->fValue).fInt64;
      break;
    case kObject:
      if ((this->fValue).fObject == (UObject *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return 0.0;
      }
      UVar1 = instanceOfMeasure((this->fValue).fObject);
      if (UVar1 != '\0') {
        this_00 = Measure::getNumber((Measure *)(this->fValue).fObject);
        dVar2 = getDouble(this_00,status);
        return dVar2;
      }
    default:
      *status = U_INVALID_FORMAT_ERROR;
      this_local = (Formattable *)0x0;
    }
  }
  else {
    this_local = (Formattable *)0x0;
  }
  return (double)this_local;
}

Assistant:

double
Formattable::getDouble(UErrorCode& status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
        
    switch (fType) {
    case Formattable::kLong: 
    case Formattable::kInt64: // loses precision
        return (double)fValue.fInt64;
    case Formattable::kDouble:
        return fValue.fDouble;
    case Formattable::kObject:
        if (fValue.fObject == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        // TODO Later replace this with instanceof call
        if (instanceOfMeasure(fValue.fObject)) {
            return ((const Measure*) fValue.fObject)->
                getNumber().getDouble(status);
        }
        U_FALLTHROUGH;
    default:
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
}